

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_access(char *filename)

{
  FILE *__stream;
  char *in_RDI;
  FILE *diskfile;
  int local_4;
  
  __stream = fopen64(in_RDI,"r");
  if (__stream == (FILE *)0x0) {
    local_4 = -1;
  }
  else {
    fclose(__stream);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int fp_access (char *filename)
{
	/* test if a file exists */
	
	FILE *diskfile;
	
	diskfile = fopen(filename, "r");

	if (diskfile) {
		fclose(diskfile);
		return(0);
	} else {
	        return(-1);
	}
}